

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

size_t __thiscall notch::io::IDXReader::readDims(IDXReader *this,istream *in)

{
  uint in_EAX;
  runtime_error *this_00;
  ulong uStack_18;
  char magic [4];
  
  uStack_18 = (ulong)in_EAX;
  std::istream::read((char *)in,(long)magic);
  if (*(long *)(in + 8) == 4) {
    if (magic[1] == '\0' && magic[0] == '\0') {
      if (magic[2] == '\b') {
        if (0xfb < (byte)(magic[3] - 5U)) {
          return (ulong)(byte)magic[3];
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"IDXReader: unsupported number of dimensions");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"IDXReader: unsupported IDX type code");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"IDXReader: not an IDX magic");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"IDXReader cannot read magic");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t readDims(std::istream &in) {
        char magic[4] = { 0, 0, 0, 0};
        in.read(magic, 4);
        size_t n = in.gcount();
        for (size_t i = 0; i<4; ++i)
        if (n != 4) {
            throw std::runtime_error("IDXReader cannot read magic");
        }
        if (magic[0] != 0 || magic[1] != 0) {
            throw std::runtime_error("IDXReader: not an IDX magic");
        }
        char typecode = magic[2];
        if (typecode != 0x08) { // unsigned byte
            throw std::runtime_error("IDXReader: unsupported IDX type code");
        }
        char dims = magic[3];
        if (dims > maxDims || dims <= 0) {
            throw std::runtime_error("IDXReader: unsupported number of dimensions");
        }
        return dims;
    }